

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O2

int hash_step(gost_ctx *c,byte *H,byte *M)

{
  int extraout_EAX;
  int iVar1;
  int extraout_EAX_00;
  size_t in_RCX;
  byte *pbVar2;
  int iVar3;
  bool bVar4;
  byte S [32];
  byte Key [32];
  byte W [32];
  byte V [32];
  byte U [32];
  
  xor_blocks(W,H,M,in_RCX);
  swap_bytes(W,Key);
  pbVar2 = S;
  gost_enc_with_key(c,Key,H,S);
  circle_xor8(H,U);
  circle_xor8(M,V);
  circle_xor8(V,V);
  xor_blocks(W,U,V,(size_t)pbVar2);
  swap_bytes(W,Key);
  pbVar2 = S + 8;
  gost_enc_with_key(c,Key,H + 8,pbVar2);
  circle_xor8(U,U);
  U[0x1f] = ~U[0x1f];
  U[0x1d] = ~U[0x1d];
  U[0x1c] = ~U[0x1c];
  U[0x18] = ~U[0x18];
  U[0x17] = ~U[0x17];
  U[0x14] = ~U[0x14];
  U[0x12] = ~U[0x12];
  U[0x11] = ~U[0x11];
  U[0xe] = ~U[0xe];
  U[0xc] = ~U[0xc];
  U[10] = ~U[10];
  U[8] = ~U[8];
  U[7] = ~U[7];
  U[5] = ~U[5];
  U[3] = ~U[3];
  U[1] = ~U[1];
  circle_xor8(V,V);
  circle_xor8(V,V);
  xor_blocks(W,U,V,(size_t)pbVar2);
  swap_bytes(W,Key);
  pbVar2 = S + 0x10;
  gost_enc_with_key(c,Key,H + 0x10,pbVar2);
  circle_xor8(U,U);
  circle_xor8(V,V);
  circle_xor8(V,V);
  xor_blocks(W,U,V,(size_t)pbVar2);
  swap_bytes(W,Key);
  pbVar2 = S + 0x18;
  gost_enc_with_key(c,Key,H + 0x18,pbVar2);
  iVar3 = 0xc;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    transform_3(S);
  }
  xor_blocks(S,S,M,(size_t)pbVar2);
  transform_3(S);
  xor_blocks(S,S,H,(size_t)pbVar2);
  iVar3 = 0x3d;
  iVar1 = extraout_EAX;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    transform_3(S);
    iVar1 = extraout_EAX_00;
  }
  *(undefined8 *)(H + 0x10) = S._16_8_;
  *(undefined8 *)(H + 0x18) = S._24_8_;
  *(undefined8 *)H = S._0_8_;
  *(undefined8 *)(H + 8) = S._8_8_;
  return iVar1;
}

Assistant:

static int hash_step(gost_ctx * c, byte * H, const byte * M)
{
    byte U[32], W[32], V[32], S[32], Key[32];
    int i;
    /* Compute first key */
    xor_blocks(W, H, M, 32);
    swap_bytes(W, Key);
    /* Encrypt first 8 bytes of H with first key */
    gost_enc_with_key(c, Key, H, S);
    /* Compute second key */
    circle_xor8(H, U);
    circle_xor8(M, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* encrypt second 8 bytes of H with second key */
    gost_enc_with_key(c, Key, H + 8, S + 8);
    /* compute third key */
    circle_xor8(U, U);
    U[31] = ~U[31];
    U[29] = ~U[29];
    U[28] = ~U[28];
    U[24] = ~U[24];
    U[23] = ~U[23];
    U[20] = ~U[20];
    U[18] = ~U[18];
    U[17] = ~U[17];
    U[14] = ~U[14];
    U[12] = ~U[12];
    U[10] = ~U[10];
    U[8] = ~U[8];
    U[7] = ~U[7];
    U[5] = ~U[5];
    U[3] = ~U[3];
    U[1] = ~U[1];
    circle_xor8(V, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* encrypt third 8 bytes of H with third key */
    gost_enc_with_key(c, Key, H + 16, S + 16);
    /* Compute fourth key */
    circle_xor8(U, U);
    circle_xor8(V, V);
    circle_xor8(V, V);
    xor_blocks(W, U, V, 32);
    swap_bytes(W, Key);
    /* Encrypt last 8 bytes with fourth key */
    gost_enc_with_key(c, Key, H + 24, S + 24);
    for (i = 0; i < 12; i++)
        transform_3(S);
    xor_blocks(S, S, M, 32);
    transform_3(S);
    xor_blocks(S, S, H, 32);
    for (i = 0; i < 61; i++)
        transform_3(S);
    memcpy(H, S, 32);
    return 1;
}